

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O1

ssize_t ossl_send(connectdata *conn,int sockindex,void *mem,size_t len,CURLcode *curlcode)

{
  uint uVar1;
  uint *puVar2;
  ulong uVar3;
  size_t sVar4;
  Curl_easy *pCVar5;
  char *pcVar6;
  char error_buffer [256];
  char acStack_128 [256];
  
  ERR_clear_error();
  sVar4 = 0x7fffffff;
  if (len < 0x7fffffff) {
    sVar4 = len;
  }
  uVar1 = SSL_write((SSL *)conn->ssl[sockindex].handle,mem,(int)sVar4);
  if ((int)uVar1 < 1) {
    uVar1 = SSL_get_error((SSL *)conn->ssl[sockindex].handle,uVar1);
    if (uVar1 - 2 < 2) {
      *curlcode = CURLE_AGAIN;
    }
    else {
      if (uVar1 == 1) {
        uVar3 = ERR_get_error();
        if ((((int)uVar3 == 0xa000080) && (conn->ssl[sockindex].state == ssl_connection_complete))
           && (conn->proxy_ssl[sockindex].state == ssl_connection_complete)) {
          Curl_ossl_version(acStack_128,0x78);
          pCVar5 = conn->data;
          pcVar6 = "Error: %s does not support double SSL tunneling.";
        }
        else {
          pCVar5 = conn->data;
          ERR_error_string_n(uVar3,acStack_128,0x100);
          pcVar6 = "SSL_write() error: %s";
        }
        Curl_failf(pCVar5,pcVar6,acStack_128);
      }
      else if (uVar1 == 5) {
        pCVar5 = conn->data;
        puVar2 = (uint *)__errno_location();
        Curl_failf(pCVar5,"SSL_write() returned SYSCALL, errno = %d",(ulong)*puVar2);
      }
      else {
        pCVar5 = conn->data;
        if (uVar1 < 0xb) {
          pcVar6 = &DAT_005b5dc0 + *(int *)(&DAT_005b5dc0 + (ulong)uVar1 * 4);
        }
        else {
          pcVar6 = "SSL_ERROR unknown";
        }
        puVar2 = (uint *)__errno_location();
        Curl_failf(pCVar5,"OpenSSL SSL_write: %s, errno %d",pcVar6,(ulong)*puVar2);
      }
      *curlcode = CURLE_SEND_ERROR;
    }
    uVar3 = 0xffffffffffffffff;
  }
  else {
    *curlcode = CURLE_OK;
    uVar3 = (ulong)uVar1;
  }
  return uVar3;
}

Assistant:

static ssize_t ossl_send(struct connectdata *conn,
                         int sockindex,
                         const void *mem,
                         size_t len,
                         CURLcode *curlcode)
{
  /* SSL_write() is said to return 'int' while write() and send() returns
     'size_t' */
  int err;
  char error_buffer[256];
  unsigned long sslerror;
  int memlen;
  int rc;

  ERR_clear_error();

  memlen = (len > (size_t)INT_MAX) ? INT_MAX : (int)len;
  rc = SSL_write(conn->ssl[sockindex].handle, mem, memlen);

  if(rc <= 0) {
    err = SSL_get_error(conn->ssl[sockindex].handle, rc);

    switch(err) {
    case SSL_ERROR_WANT_READ:
    case SSL_ERROR_WANT_WRITE:
      /* The operation did not complete; the same TLS/SSL I/O function
         should be called again later. This is basically an EWOULDBLOCK
         equivalent. */
      *curlcode = CURLE_AGAIN;
      return -1;
    case SSL_ERROR_SYSCALL:
      failf(conn->data, "SSL_write() returned SYSCALL, errno = %d",
            SOCKERRNO);
      *curlcode = CURLE_SEND_ERROR;
      return -1;
    case SSL_ERROR_SSL:
      /*  A failure in the SSL library occurred, usually a protocol error.
          The OpenSSL error queue contains more information on the error. */
      sslerror = ERR_get_error();
      if(ERR_GET_LIB(sslerror) == ERR_LIB_SSL &&
         ERR_GET_REASON(sslerror) == SSL_R_BIO_NOT_SET &&
         conn->ssl[sockindex].state == ssl_connection_complete &&
         conn->proxy_ssl[sockindex].state == ssl_connection_complete) {
        char ver[120];
        Curl_ossl_version(ver, 120);
        failf(conn->data, "Error: %s does not support double SSL tunneling.",
              ver);
      }
      else
        failf(conn->data, "SSL_write() error: %s",
              ossl_strerror(sslerror, error_buffer, sizeof(error_buffer)));
      *curlcode = CURLE_SEND_ERROR;
      return -1;
    }
    /* a true error */
    failf(conn->data, OSSL_PACKAGE " SSL_write: %s, errno %d",
          SSL_ERROR_to_str(err), SOCKERRNO);
    *curlcode = CURLE_SEND_ERROR;
    return -1;
  }
  *curlcode = CURLE_OK;
  return (ssize_t)rc; /* number of bytes */
}